

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O1

QList<QKeyCombination> *
QXkbCommon::possibleKeyCombinations
          (QList<QKeyCombination> *__return_storage_ptr__,xkb_state *state,QKeyEvent *event,
          bool superAsMeta,bool hyperAsMeta)

{
  char *pcVar1;
  xkb_keycode_t code;
  long i_00;
  QDebug QVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  KeyboardModifiers KVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  xkb_keysym_t xVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  xkb_state *state_00;
  QLoggingCategory *pQVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint i;
  long lVar22;
  uint uVar23;
  storage_type *psVar24;
  long lVar25;
  bool bVar26;
  QFlagsStorage<Qt::KeyboardModifier> modifiers;
  long in_FS_OFFSET;
  bool bVar27;
  undefined1 auVar28 [16];
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QKeyCombination local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QKeyCombination *)0x0;
  (__return_storage_ptr__->d).size = 0;
  code = event->m_scanCode;
  if (code != 0) {
    KVar6 = QKeyEvent::modifiers(event);
    uVar17 = xkb_state_get_keymap(state);
    state_00 = (xkb_state *)xkb_state_new(uVar17);
    if (state_00 == (xkb_state *)0x0) {
      pQVar18 = QtPrivateLogging::lcQpaKeyMapper();
      if (((pQVar18->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_60 = pQVar18->name;
        local_78.combination = 2;
        local_74 = 0;
        uStack_6c = 0;
        local_64 = 0;
        QMessageLogger::warning();
        QVar2.stream = local_58.stream;
        psVar24 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar24 + 0x6de2a7;
          psVar24 = psVar24 + 1;
        } while (*pcVar1 != '\0');
        QVar29.m_data = psVar24;
        QVar29.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar29);
        QTextStream::operator<<(&(QVar2.stream)->ts,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_58.stream)->space == true) {
          QTextStream::operator<<(&(local_58.stream)->ts,' ');
        }
        QVar2.stream = local_58.stream;
        QVar30.m_data = (storage_type *)0x1c;
        QVar30.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar30);
        QTextStream::operator<<(&(QVar2.stream)->ts,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_58.stream)->space == true) {
          QTextStream::operator<<(&(local_58.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_58);
      }
    }
    else {
      uVar7 = xkb_state_serialize_layout(state,0x40);
      uVar8 = xkb_state_serialize_mods(state,2);
      uVar9 = xkb_state_serialize_mods(state,4);
      uVar10 = xkb_state_serialize_mods(state,1);
      xkb_state_update_mask(state_00,uVar10,uVar8,uVar9,0,0,uVar7);
      iVar11 = xkb_state_key_get_layout(state_00,code);
      if ((iVar11 == -1) ||
         (iVar11 = xkb_state_key_get_level(state_00,code,iVar11), iVar11 + 1U < 3)) {
        xkb_state_update_mask(state_00,0,uVar8,uVar9,0,0,uVar7);
      }
      xVar12 = xkb_state_key_get_one_sym(state_00,code);
      if (xVar12 != 0) {
        KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
        super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
             ((uint)KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                    super_QFlagsStorage<Qt::KeyboardModifier>.i & 0x9fffffff);
        uVar13 = keysymToQtKey_internal(xVar12,KVar6,state_00,code,superAsMeta,hyperAsMeta);
        if (uVar13 != 0) {
          local_78.combination =
               (int)KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                    super_QFlagsStorage<Qt::KeyboardModifier>.i + uVar13;
          QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination>
                    ((QMovableArrayOps<QKeyCombination> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_78);
          QList<QKeyCombination>::end(__return_storage_ptr__);
        }
        bVar3 = xkb_keymap_mod_get_index(uVar17,"Shift");
        bVar4 = xkb_keymap_mod_get_index(uVar17,"Alt");
        bVar5 = xkb_keymap_mod_get_index(uVar17,"Control");
        uVar14 = xkb_keymap_mod_get_index(uVar17,"Meta");
        lVar22 = 1;
        do {
          uVar16 = ModsTbl[lVar22].super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                   super_QFlagsStorage<Qt::KeyboardModifier>.i;
          if ((~(uint)KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                      super_QFlagsStorage<Qt::KeyboardModifier>.i & uVar16) == 0) {
            if (lVar22 == 8) {
              if (uVar13 - 0x20 < 0xe0) goto LAB_006607d7;
              xVar12 = lookupLatinKeysym(state,code);
            }
            else {
              auVar28._0_4_ = -(uint)((uVar16 & 0x10000000) == 0);
              auVar28._4_4_ = -(uint)((uVar16 & 0x4000000) == 0);
              auVar28._8_4_ = -(uint)((uVar16 & 0x2000000) == 0);
              auVar28._12_4_ = -(uint)((uVar16 & 0x8000000) == 0);
              uVar15 = movmskps(0x6de270,auVar28);
              uVar19 = 1 << (bVar4 & 0x1f);
              if ((uVar15 & 8) != 0) {
                uVar19 = 0;
              }
              uVar21 = 1 << (bVar3 & 0x1f);
              if ((uVar15 & 4) != 0) {
                uVar21 = 0;
              }
              uVar20 = 1 << (bVar5 & 0x1f);
              if ((uVar15 & 2) != 0) {
                uVar20 = 0;
              }
              uVar23 = 1 << ((byte)uVar14 & 0x1f);
              if ((uVar15 & 1) != 0) {
                uVar23 = 0;
              }
              if (0x1f < uVar14) {
                uVar23 = 0;
              }
              xkb_state_update_mask
                        (state_00,uVar23 | uVar20 | uVar21 | uVar19,uVar8,uVar9,0,0,uVar7);
              xVar12 = xkb_state_key_get_one_sym(state_00,code);
            }
            if (xVar12 != 0) {
              modifiers.i = ~uVar16 & (uint)KVar6.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>
                                            .super_QFlagsStorage<Qt::KeyboardModifier>.i;
              uVar16 = keysymToQtKey_internal
                                 (xVar12,(KeyboardModifiers)modifiers.i,state_00,code,superAsMeta,
                                  hyperAsMeta);
              if (uVar16 != uVar13 && uVar16 != 0) {
                i_00 = (__return_storage_ptr__->d).size;
                if (i_00 != 0) {
                  lVar25 = 0;
                  do {
                    uVar19 = *(uint *)((long)&((__return_storage_ptr__->d).ptr)->combination +
                                      lVar25);
                    bVar26 = false;
                    if ((uVar19 & modifiers.i & 0x9e000000) == modifiers.i &&
                        (uVar19 & 0x1ffffff) == uVar16) {
                      bVar26 = true;
                      break;
                    }
                    bVar27 = i_00 * 4 + -4 != lVar25;
                    lVar25 = lVar25 + 4;
                  } while (bVar27);
                  if (bVar26) goto LAB_006607d7;
                }
                local_78.combination = uVar16 + modifiers.i;
                QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination>
                          ((QMovableArrayOps<QKeyCombination> *)__return_storage_ptr__,i_00,
                           &local_78);
                QList<QKeyCombination>::end(__return_storage_ptr__);
              }
            }
          }
LAB_006607d7:
          lVar22 = lVar22 + 1;
        } while (lVar22 != 9);
      }
    }
    if (state_00 != (xkb_state *)0x0) {
      xkb_state_unref();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QKeyCombination> QXkbCommon::possibleKeyCombinations(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<QKeyCombination> result;
    quint32 keycode = event->nativeScanCode();
    if (!keycode)
        return result;

    Qt::KeyboardModifiers modifiers = event->modifiers();
    xkb_keymap *keymap = xkb_state_get_keymap(state);
    // turn off the modifier bits which doesn't participate in shortcuts
    Qt::KeyboardModifiers notNeeded = Qt::KeypadModifier | Qt::GroupSwitchModifier;
    modifiers &= ~notNeeded;
    // create a fresh kb state and test against the relevant modifier combinations
    ScopedXKBState scopedXkbQueryState(xkb_state_new(keymap));
    xkb_state *queryState = scopedXkbQueryState.get();
    if (!queryState) {
        qCWarning(lcQpaKeyMapper) << Q_FUNC_INFO << "failed to compile xkb keymap";
        return result;
    }
    // get kb state from the master state and update the temporary state
    xkb_layout_index_t lockedLayout = xkb_state_serialize_layout(state, XKB_STATE_LAYOUT_LOCKED);
    xkb_mod_mask_t latchedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LATCHED);
    xkb_mod_mask_t lockedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_LOCKED);
    xkb_mod_mask_t depressedMods = xkb_state_serialize_mods(state, XKB_STATE_MODS_DEPRESSED);
    xkb_state_update_mask(queryState, depressedMods, latchedMods, lockedMods, 0, 0, lockedLayout);
    // handle shortcuts for level three and above
    xkb_layout_index_t layoutIndex = xkb_state_key_get_layout(queryState, keycode);
    xkb_level_index_t levelIndex = 0;
    if (layoutIndex != XKB_LAYOUT_INVALID) {
        levelIndex = xkb_state_key_get_level(queryState, keycode, layoutIndex);
        if (levelIndex == XKB_LEVEL_INVALID)
            levelIndex = 0;
    }
    if (levelIndex <= 1)
        xkb_state_update_mask(queryState, 0, latchedMods, lockedMods, 0, 0, lockedLayout);

    xkb_keysym_t sym = xkb_state_key_get_one_sym(queryState, keycode);
    if (sym == XKB_KEY_NoSymbol)
        return result;

    int baseQtKey = keysymToQtKey_internal(sym, modifiers, queryState, keycode, superAsMeta, hyperAsMeta);
    if (baseQtKey)
        result += QKeyCombination::fromCombined(baseQtKey + int(modifiers));

    xkb_mod_index_t shiftMod = xkb_keymap_mod_get_index(keymap, "Shift");
    xkb_mod_index_t altMod = xkb_keymap_mod_get_index(keymap, "Alt");
    xkb_mod_index_t controlMod = xkb_keymap_mod_get_index(keymap, "Control");
    xkb_mod_index_t metaMod = xkb_keymap_mod_get_index(keymap, "Meta");

    Q_ASSERT(shiftMod < 32);
    Q_ASSERT(altMod < 32);
    Q_ASSERT(controlMod < 32);

    xkb_mod_mask_t depressed;
    int qtKey = 0;
    // obtain a list of possible shortcuts for the given key event
    for (uint i = 1; i < sizeof(ModsTbl) / sizeof(*ModsTbl) ; ++i) {
        Qt::KeyboardModifiers neededMods = ModsTbl[i];
        if ((modifiers & neededMods) == neededMods) {
            if (i == 8) {
                if (isLatin1(baseQtKey))
                    continue;
                // add a latin key as a fall back key
                sym = lookupLatinKeysym(state, keycode);
            } else {
                depressed = 0;
                if (neededMods & Qt::AltModifier)
                    depressed |= (1 << altMod);
                if (neededMods & Qt::ShiftModifier)
                    depressed |= (1 << shiftMod);
                if (neededMods & Qt::ControlModifier)
                    depressed |= (1 << controlMod);
                if (metaMod < 32 && neededMods & Qt::MetaModifier)
                    depressed |= (1 << metaMod);
                xkb_state_update_mask(queryState, depressed, latchedMods, lockedMods, 0, 0, lockedLayout);
                sym = xkb_state_key_get_one_sym(queryState, keycode);
            }
            if (sym == XKB_KEY_NoSymbol)
                continue;

            Qt::KeyboardModifiers mods = modifiers & ~neededMods;
            qtKey = keysymToQtKey_internal(sym, mods, queryState, keycode, superAsMeta, hyperAsMeta);
            if (!qtKey || qtKey == baseQtKey)
                continue;

            // catch only more specific shortcuts, i.e. Ctrl+Shift+= also generates Ctrl++ and +,
            // but Ctrl++ is more specific than +, so we should skip the last one
            bool ambiguous = false;
            for (auto keyCombination : std::as_const(result)) {
                if (keyCombination.key() == qtKey
                    && (keyCombination.keyboardModifiers() & mods) == mods) {
                    ambiguous = true;
                    break;
                }
            }
            if (ambiguous)
                continue;

            result += QKeyCombination::fromCombined(qtKey + int(mods));
        }
    }

    return result;
}